

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostConfigFlags.cpp
# Opt level: O2

int HostConfigFlags::FindArg(int argc,PWSTR *argv,PCWSTR targetArg,size_t targetArgLen)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 1;
  while( true ) {
    if (argc <= lVar2) {
      return -1;
    }
    iVar1 = _wcsnicmp(argv[lVar2],targetArg,targetArgLen);
    if (iVar1 == 0) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int HostConfigFlags::FindArg(int argc, _In_reads_(argc) PWSTR argv[], PCWSTR targetArg, size_t targetArgLen)
{
    return FindArg(argc, argv, [=](PCWSTR arg) -> bool
    {
        return _wcsnicmp(arg, targetArg, targetArgLen) == 0;
    });
}